

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O0

int unix_madvise(void *addr,size_t size,int advice)

{
  int iVar1;
  int *piVar2;
  int in_EDX;
  size_t in_RSI;
  void *in_RDI;
  int res;
  undefined4 local_1c;
  
  iVar1 = madvise(in_RDI,in_RSI,in_EDX);
  if (iVar1 == 0) {
    local_1c = 0;
  }
  else {
    piVar2 = __errno_location();
    local_1c = *piVar2;
  }
  return local_1c;
}

Assistant:

static int unix_madvise(void* addr, size_t size, int advice) {
  #if defined(__sun)
  int res = madvise((caddr_t)addr, size, advice);  // Solaris needs cast (issue #520)
  #elif defined(__QNX__)
  int res = posix_madvise(addr, size, advice);
  #else
  int res = madvise(addr, size, advice);
  #endif
  return (res==0 ? 0 : errno);
}